

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::MixedContentModel::hasDups(MixedContentModel *this)

{
  XMLCh XVar1;
  QName *this_00;
  XMLCh *pXVar2;
  XMLCh *pXVar3;
  XMLCh XVar4;
  XMLSize_t index;
  ulong uVar5;
  XMLSize_t iIndex;
  ulong uVar6;
  
  if (this->fCount < 2) {
    return false;
  }
  uVar5 = 0;
  do {
    this_00 = this->fChildren[uVar5];
    uVar6 = 0;
    do {
      if (uVar6 != uVar5) {
        if (this->fDTD == true) {
          pXVar2 = QName::getRawName(this_00);
          pXVar3 = QName::getRawName(this->fChildren[uVar6]);
          if (pXVar2 == pXVar3) {
            return true;
          }
          if ((pXVar2 == (XMLCh *)0x0) || (pXVar3 == (XMLCh *)0x0)) {
            if (pXVar2 == (XMLCh *)0x0) {
LAB_002ebfd8:
              if (pXVar3 == (XMLCh *)0x0) {
                return true;
              }
            }
            else {
              XVar4 = *pXVar2;
LAB_002ebfc7:
              if ((pXVar3 == (XMLCh *)0x0) || (XVar4 != L'\0')) {
                if (XVar4 == L'\0') {
                  return true;
                }
                goto LAB_002ebfe3;
              }
            }
LAB_002ebfdd:
            if (*pXVar3 == L'\0') {
              return true;
            }
          }
          else {
            do {
              XVar4 = *pXVar2;
              if (XVar4 == L'\0') goto LAB_002ebfdd;
              pXVar2 = pXVar2 + 1;
              XVar1 = *pXVar3;
              pXVar3 = pXVar3 + 1;
            } while (XVar4 == XVar1);
          }
        }
        else if (this_00->fURIId == this->fChildren[uVar6]->fURIId) {
          pXVar2 = this_00->fLocalPart;
          pXVar3 = this->fChildren[uVar6]->fLocalPart;
          if (pXVar2 == pXVar3) {
            return true;
          }
          if ((pXVar2 == (XMLCh *)0x0) || (pXVar3 == (XMLCh *)0x0)) {
            if (pXVar2 == (XMLCh *)0x0) goto LAB_002ebfd8;
            XVar4 = *pXVar2;
            goto LAB_002ebfc7;
          }
          do {
            XVar4 = *pXVar2;
            if (XVar4 == L'\0') goto LAB_002ebfdd;
            pXVar2 = pXVar2 + 1;
            XVar1 = *pXVar3;
            pXVar3 = pXVar3 + 1;
          } while (XVar4 == XVar1);
        }
      }
LAB_002ebfe3:
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->fCount);
    uVar5 = uVar5 + 1;
    if (this->fCount <= uVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool MixedContentModel::hasDups() const
{
    // Can't have dups if only one child
    if (fCount == 1)
        return false;

    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const QName* curVal = fChildren[index];
        for (XMLSize_t iIndex = 0; iIndex < fCount; iIndex++)
        {
            if (iIndex == index)
                continue;

            if (fDTD) {
                if (XMLString::equals(curVal->getRawName(), fChildren[iIndex]->getRawName())) {
                    return true;
                }
            }
            else {
                if ((curVal->getURI() == fChildren[iIndex]->getURI()) &&
                    (XMLString::equals(curVal->getLocalPart(), fChildren[iIndex]->getLocalPart()))) {
                    return true;
                }
            }
        }
    }
    return false;
}